

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmac.c
# Opt level: O0

int mbedtls_cipher_cmac_update(mbedtls_cipher_context_t *ctx,uchar *input,size_t ilen)

{
  int iVar1;
  ulong block_size_00;
  size_t block_size;
  size_t olen;
  size_t j;
  size_t n;
  mbedtls_cmac_context_t *pmStack_38;
  int ret;
  uchar *state;
  mbedtls_cmac_context_t *cmac_ctx;
  size_t ilen_local;
  uchar *input_local;
  mbedtls_cipher_context_t *ctx_local;
  
  n._4_4_ = 0;
  if ((((ctx != (mbedtls_cipher_context_t *)0x0) &&
       (ctx->cipher_info != (mbedtls_cipher_info_t *)0x0)) && (input != (uchar *)0x0)) &&
     (ctx->cmac_ctx != (mbedtls_cmac_context_t *)0x0)) {
    state = ctx->cmac_ctx->state;
    block_size_00 = (ulong)ctx->cipher_info->block_size;
    pmStack_38 = ctx->cmac_ctx;
    cmac_ctx = (mbedtls_cmac_context_t *)ilen;
    ilen_local = (size_t)input;
    input_local = (uchar *)ctx;
    if ((((mbedtls_cmac_context_t *)state)->unprocessed_len != 0) &&
       (block_size_00 - ((mbedtls_cmac_context_t *)state)->unprocessed_len < ilen)) {
      memcpy(((mbedtls_cmac_context_t *)state)->unprocessed_block +
             ((mbedtls_cmac_context_t *)state)->unprocessed_len,input,
             block_size_00 - ((mbedtls_cmac_context_t *)state)->unprocessed_len);
      cmac_xor_block(pmStack_38->state,state + 0x10,pmStack_38->state,block_size_00);
      iVar1 = mbedtls_cipher_update
                        ((mbedtls_cipher_context_t *)input_local,pmStack_38->state,block_size_00,
                         pmStack_38->state,&block_size);
      if (iVar1 != 0) {
        return iVar1;
      }
      ilen_local = (block_size_00 - *(long *)(state + 0x20)) + ilen_local;
      cmac_ctx = (mbedtls_cmac_context_t *)
                 ((long)cmac_ctx - (block_size_00 - *(long *)(state + 0x20)));
      state[0x20] = '\0';
      state[0x21] = '\0';
      state[0x22] = '\0';
      state[0x23] = '\0';
      state[0x24] = '\0';
      state[0x25] = '\0';
      state[0x26] = '\0';
      state[0x27] = '\0';
    }
    j = (ulong)(cmac_ctx->state + (block_size_00 - 1)) / block_size_00;
    olen = 1;
    while( true ) {
      n._4_4_ = 0;
      if (j <= olen) {
        if (cmac_ctx != (mbedtls_cmac_context_t *)0x0) {
          memcpy(state + *(long *)(state + 0x20) + 0x10,(void *)ilen_local,(size_t)cmac_ctx);
          *(uchar **)(state + 0x20) = cmac_ctx->state + *(long *)(state + 0x20);
        }
        return n._4_4_;
      }
      cmac_xor_block(pmStack_38->state,(uchar *)ilen_local,pmStack_38->state,block_size_00);
      iVar1 = mbedtls_cipher_update
                        ((mbedtls_cipher_context_t *)input_local,pmStack_38->state,block_size_00,
                         pmStack_38->state,&block_size);
      if (iVar1 != 0) break;
      cmac_ctx = (mbedtls_cmac_context_t *)((long)cmac_ctx - block_size_00);
      ilen_local = block_size_00 + ilen_local;
      olen = olen + 1;
    }
    return iVar1;
  }
  return -0x6100;
}

Assistant:

int mbedtls_cipher_cmac_update( mbedtls_cipher_context_t *ctx,
                                const unsigned char *input, size_t ilen )
{
    mbedtls_cmac_context_t* cmac_ctx;
    unsigned char *state;
    int ret = 0;
    size_t n, j, olen, block_size;

    if( ctx == NULL || ctx->cipher_info == NULL || input == NULL ||
        ctx->cmac_ctx == NULL )
        return( MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA );

    cmac_ctx = ctx->cmac_ctx;
    block_size = ctx->cipher_info->block_size;
    state = ctx->cmac_ctx->state;

    /* Is there data still to process from the last call, that's greater in
     * size than a block? */
    if( cmac_ctx->unprocessed_len > 0 &&
        ilen > block_size - cmac_ctx->unprocessed_len )
    {
        memcpy( &cmac_ctx->unprocessed_block[cmac_ctx->unprocessed_len],
                input,
                block_size - cmac_ctx->unprocessed_len );

        cmac_xor_block( state, cmac_ctx->unprocessed_block, state, block_size );

        if( ( ret = mbedtls_cipher_update( ctx, state, block_size, state,
                                           &olen ) ) != 0 )
        {
           goto exit;
        }

        input += block_size - cmac_ctx->unprocessed_len;
        ilen -= block_size - cmac_ctx->unprocessed_len;
        cmac_ctx->unprocessed_len = 0;
    }

    /* n is the number of blocks including any final partial block */
    n = ( ilen + block_size - 1 ) / block_size;

    /* Iterate across the input data in block sized chunks, excluding any
     * final partial or complete block */
    for( j = 1; j < n; j++ )
    {
        cmac_xor_block( state, input, state, block_size );

        if( ( ret = mbedtls_cipher_update( ctx, state, block_size, state,
                                           &olen ) ) != 0 )
           goto exit;

        ilen -= block_size;
        input += block_size;
    }

    /* If there is data left over that wasn't aligned to a block */
    if( ilen > 0 )
    {
        memcpy( &cmac_ctx->unprocessed_block[cmac_ctx->unprocessed_len],
                input,
                ilen );
        cmac_ctx->unprocessed_len += ilen;
    }

exit:
    return( ret );
}